

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_NtkPowerTest(void)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = 0;
  do {
    lVar6 = -1;
    uVar3 = 0;
    do {
      lVar1 = lVar6;
      uVar4 = uVar5;
      if (1 < uVar3) {
        do {
          uVar4 = uVar4 * uVar5;
          lVar1 = lVar1 + -1;
        } while (lVar1 != 0);
      }
      uVar2 = 5;
      do {
        printf("%d",(ulong)((uVar5 >> ((ulong)((int)uVar2 - 2U & 0xff) & 0x3f) & 1) != 0));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
      uVar2 = 5;
      do {
        printf("%d",(ulong)((uVar3 >> ((ulong)((int)uVar2 - 2U & 0xff) & 0x3f) & 1) != 0));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
      putchar(0x20);
      uVar2 = 0x41;
      do {
        printf("%d",(ulong)((uVar4 >> ((ulong)((int)uVar2 - 2U & 0xff) & 0x3f) & 1) != 0));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
      putchar(10);
      uVar3 = uVar3 + 1;
      lVar6 = lVar6 + 1;
    } while (uVar3 != 0x10);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x10);
  return;
}

Assistant:

void Extra_NtkPowerTest()
{
    int i, j, k, n = 4;
    for ( i = 0; i < (1<<n); i++ )
    for ( j = 0; j < (1<<n); j++ )
    {
        word t = (word)i;
        for ( k = 1; k < j; k++ )
            t *= (word)i;
        Extra_NtkPrintBin( (word *)&i, n );
        Extra_NtkPrintBin( (word *)&j, n );
        printf( " " );
        Extra_NtkPrintBin( (word *)&t, 64 );
        printf( "\n" );
    }
}